

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::end_document
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,error_code *ec)

{
  pointer ppVar1;
  size_t sVar2;
  long lVar3;
  assertion_error *this_00;
  allocator<char> local_39;
  string local_38;
  
  lVar3 = (long)(this->state_stack_).
                super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->state_stack_).
                super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(lVar3 / 0x28)) {
    (*visitor->_vptr_basic_json_visitor[5])(visitor,this,ec);
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
    ppVar1 = (this->state_stack_).
             super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this->mark_level_ ==
        (int)(((long)ppVar1 -
              (long)(this->state_stack_).
                    super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
      this->more_ = false;
    }
    sVar2 = ppVar1[-1].pos;
    if (sVar2 == ppVar1[-1].length) {
      (this->state_stack_).
      super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppVar1 + -1;
      ppVar1[-2].pos = ppVar1[-2].pos + sVar2;
    }
    else {
      std::error_code::operator=(ec,size_mismatch);
      this->more_ = false;
    }
    return;
  }
  this_00 = (assertion_error *)__cxa_allocate_exception(0x10,visitor,lVar3 % 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"assertion \'state_stack_.size() >= 2\' failed at  <> :0",&local_39
            );
  assertion_error::assertion_error(this_00,&local_38);
  __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void end_document(json_visitor& visitor, std::error_code& ec)
    {
        JSONCONS_ASSERT(state_stack_.size() >= 2);

        visitor.end_object(*this,ec);
        more_ = !cursor_mode_;
        if (level() == mark_level_)
        {
            more_ = false;
        }
        if (JSONCONS_UNLIKELY(state_stack_.back().pos != state_stack_.back().length))
        {
            ec = bson_errc::size_mismatch;
            more_ = false;
            return;
        }
        std::size_t pos = state_stack_.back().pos;
        state_stack_.pop_back();
        state_stack_.back().pos += pos;
    }